

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_primitive_coerceASTNodeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong valueExpression;
  _Bool _Var1;
  sysbvm_bitflags_t sVar2;
  sysbvm_tuple_t sVar3;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  valueExpression = arguments[1];
  if ((((valueExpression & 0xf) == 0 && valueExpression != 0) &&
      (sVar3 = *(sysbvm_tuple_t *)(valueExpression + 0x20), sVar3 != 0)) &&
     (_Var1 = sysbvm_type_isDirectSubtypeOf(sVar3,(context->roots).controlFlowEscapeType), !_Var1))
  {
    _Var1 = sysbvm_tuple_isDummyValue(sVar3);
    if ((!_Var1) && (sVar2 = sysbvm_type_getFlags(sVar3), (sVar2 & 0x40) == 0)) {
      sysbvm_error("Cannot perform the node type coercion.");
      return arguments[1];
    }
    sVar3 = sysbvm_astDownCastNode_addOntoNodeWithTargetType(context,valueExpression,*arguments);
    return sVar3;
  }
  return valueExpression;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_primitive_coerceASTNodeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_t *targetType = &arguments[0];
    sysbvm_tuple_t *astNode = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    (void)targetType;
    (void)environment;

    sysbvm_tuple_t sourceType = sysbvm_astNode_getAnalyzedType(*astNode);
    if(sourceType && !sysbvm_type_isDirectSubtypeOf(sourceType, context->roots.controlFlowEscapeType))
    {
        if(sysbvm_type_isDynamic(sourceType))
        {
            // Add a downcast for the untyped case.
            return sysbvm_astDownCastNode_addOntoNodeWithTargetType(context, *astNode, *targetType);
        }
        else
        {
            sysbvm_error("Cannot perform the node type coercion.");
        }
    }

    return *astNode;
}